

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

ZSTD_bounds duckdb_zstd::ZSTD_cParam_getBounds(ZSTD_cParameter param)

{
  ZSTD_bounds ZVar1;
  int in_EDI;
  ZSTD_bounds bounds;
  undefined8 local_18;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_18 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  if (in_EDI == 10) {
    uStack_10 = 0;
    uStack_c = 1;
  }
  else if (in_EDI == 100) {
    uStack_10 = ZSTD_minCLevel();
    uStack_c = ZSTD_maxCLevel();
  }
  else if (in_EDI == 0x65) {
    uStack_10 = 10;
    uStack_c = 0x1f;
  }
  else if (in_EDI == 0x66) {
    uStack_10 = 6;
    uStack_c = 0x1e;
  }
  else if (in_EDI == 0x67) {
    uStack_10 = 6;
    uStack_c = 0x1e;
  }
  else if (in_EDI == 0x68) {
    uStack_10 = 1;
    uStack_c = 0x1e;
  }
  else if (in_EDI == 0x69) {
    uStack_10 = 3;
    uStack_c = 7;
  }
  else if (in_EDI == 0x6a) {
    uStack_10 = 0;
    uStack_c = 0x20000;
  }
  else if (in_EDI == 0x6b) {
    uStack_10 = 1;
    uStack_c = 9;
  }
  else if (in_EDI == 0x82) {
    uStack_10 = 0x53c;
    uStack_c = 0x20000;
  }
  else if (in_EDI == 0xa0) {
    uStack_10 = 0;
    uStack_c = 2;
  }
  else if (in_EDI == 0xa1) {
    uStack_10 = 6;
    uStack_c = 0x1e;
  }
  else if (in_EDI == 0xa2) {
    uStack_10 = 4;
    uStack_c = 0x1000;
  }
  else if (in_EDI == 0xa3) {
    uStack_10 = 1;
    uStack_c = 8;
  }
  else if (in_EDI == 0xa4) {
    uStack_10 = 0;
    uStack_c = 0x19;
  }
  else if (in_EDI == 200) {
    uStack_10 = 0;
    uStack_c = 1;
  }
  else if (in_EDI == 0xc9) {
    uStack_10 = 0;
    uStack_c = 1;
  }
  else if (in_EDI == 0xca) {
    uStack_10 = 0;
    uStack_c = 1;
  }
  else if (in_EDI == 400) {
    uStack_10 = 0;
    uStack_c = 0;
  }
  else if (in_EDI == 0x191) {
    uStack_10 = 0;
    uStack_c = 0;
  }
  else if (in_EDI == 0x192) {
    uStack_10 = 0;
    uStack_c = 0;
  }
  else if (in_EDI == 500) {
    uStack_10 = 0;
    uStack_c = 1;
  }
  else if (in_EDI == 1000) {
    uStack_10 = 0;
    uStack_c = 1;
  }
  else if (in_EDI == 0x3e9) {
    uStack_10 = 0;
    uStack_c = 3;
  }
  else if (in_EDI == 0x3ea) {
    uStack_10 = 0;
    uStack_c = 2;
  }
  else if (in_EDI == 0x3ec) {
    uStack_10 = 0;
    uStack_c = 0x7fffffff;
  }
  else if (in_EDI == 0x3ed) {
    uStack_10 = 0;
    uStack_c = 1;
  }
  else if (in_EDI - 0x3eeU < 2) {
    uStack_10 = 0;
    uStack_c = 1;
  }
  else if (in_EDI == 0x3f0) {
    uStack_10 = 0;
    uStack_c = 1;
  }
  else if (in_EDI == 0x3f1) {
    uStack_10 = 0;
    uStack_c = 1;
  }
  else if (in_EDI == 0x3f2) {
    uStack_10 = 0;
    uStack_c = 2;
  }
  else if (in_EDI == 0x3f3) {
    uStack_10 = 0;
    uStack_c = 2;
  }
  else if (in_EDI == 0x3f4) {
    uStack_10 = 0;
    uStack_c = 1;
  }
  else if (in_EDI == 0x3f5) {
    uStack_10 = 0;
    uStack_c = 2;
  }
  else if (in_EDI == 0x3f6) {
    uStack_10 = 0;
    uStack_c = 1;
  }
  else if (in_EDI == 0x3f7) {
    uStack_10 = 0x400;
    uStack_c = 0x20000;
  }
  else if (in_EDI == 0x3f8) {
    uStack_10 = 0;
    uStack_c = 2;
  }
  else {
    local_18 = 0xffffffffffffffd8;
  }
  ZVar1.lowerBound = uStack_10;
  ZVar1.error = local_18;
  ZVar1.upperBound = uStack_c;
  return ZVar1;
}

Assistant:

ZSTD_bounds ZSTD_cParam_getBounds(ZSTD_cParameter param)
{
    ZSTD_bounds bounds = { 0, 0, 0 };

    switch(param)
    {
    case ZSTD_c_compressionLevel:
        bounds.lowerBound = ZSTD_minCLevel();
        bounds.upperBound = ZSTD_maxCLevel();
        return bounds;

    case ZSTD_c_windowLog:
        bounds.lowerBound = ZSTD_WINDOWLOG_MIN;
        bounds.upperBound = ZSTD_WINDOWLOG_MAX;
        return bounds;

    case ZSTD_c_hashLog:
        bounds.lowerBound = ZSTD_HASHLOG_MIN;
        bounds.upperBound = ZSTD_HASHLOG_MAX;
        return bounds;

    case ZSTD_c_chainLog:
        bounds.lowerBound = ZSTD_CHAINLOG_MIN;
        bounds.upperBound = ZSTD_CHAINLOG_MAX;
        return bounds;

    case ZSTD_c_searchLog:
        bounds.lowerBound = ZSTD_SEARCHLOG_MIN;
        bounds.upperBound = ZSTD_SEARCHLOG_MAX;
        return bounds;

    case ZSTD_c_minMatch:
        bounds.lowerBound = ZSTD_MINMATCH_MIN;
        bounds.upperBound = ZSTD_MINMATCH_MAX;
        return bounds;

    case ZSTD_c_targetLength:
        bounds.lowerBound = ZSTD_TARGETLENGTH_MIN;
        bounds.upperBound = ZSTD_TARGETLENGTH_MAX;
        return bounds;

    case ZSTD_c_strategy:
        bounds.lowerBound = ZSTD_STRATEGY_MIN;
        bounds.upperBound = ZSTD_STRATEGY_MAX;
        return bounds;

    case ZSTD_c_contentSizeFlag:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_checksumFlag:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_dictIDFlag:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_nbWorkers:
        bounds.lowerBound = 0;
#ifdef ZSTD_MULTITHREAD
        bounds.upperBound = ZSTDMT_NBWORKERS_MAX;
#else
        bounds.upperBound = 0;
#endif
        return bounds;

    case ZSTD_c_jobSize:
        bounds.lowerBound = 0;
#ifdef ZSTD_MULTITHREAD
        bounds.upperBound = ZSTDMT_JOBSIZE_MAX;
#else
        bounds.upperBound = 0;
#endif
        return bounds;

    case ZSTD_c_overlapLog:
#ifdef ZSTD_MULTITHREAD
        bounds.lowerBound = ZSTD_OVERLAPLOG_MIN;
        bounds.upperBound = ZSTD_OVERLAPLOG_MAX;
#else
        bounds.lowerBound = 0;
        bounds.upperBound = 0;
#endif
        return bounds;

    case ZSTD_c_enableDedicatedDictSearch:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_enableLongDistanceMatching:
        bounds.lowerBound = (int)ZSTD_ps_auto;
        bounds.upperBound = (int)ZSTD_ps_disable;
        return bounds;

    case ZSTD_c_ldmHashLog:
        bounds.lowerBound = ZSTD_LDM_HASHLOG_MIN;
        bounds.upperBound = ZSTD_LDM_HASHLOG_MAX;
        return bounds;

    case ZSTD_c_ldmMinMatch:
        bounds.lowerBound = ZSTD_LDM_MINMATCH_MIN;
        bounds.upperBound = ZSTD_LDM_MINMATCH_MAX;
        return bounds;

    case ZSTD_c_ldmBucketSizeLog:
        bounds.lowerBound = ZSTD_LDM_BUCKETSIZELOG_MIN;
        bounds.upperBound = ZSTD_LDM_BUCKETSIZELOG_MAX;
        return bounds;

    case ZSTD_c_ldmHashRateLog:
        bounds.lowerBound = ZSTD_LDM_HASHRATELOG_MIN;
        bounds.upperBound = ZSTD_LDM_HASHRATELOG_MAX;
        return bounds;

    /* experimental parameters */
    case ZSTD_c_rsyncable:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_forceMaxWindow :
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_format:
        ZSTD_STATIC_ASSERT(ZSTD_f_zstd1 < ZSTD_f_zstd1_magicless);
        bounds.lowerBound = ZSTD_f_zstd1;
        bounds.upperBound = ZSTD_f_zstd1_magicless;   /* note : how to ensure at compile time that this is the highest value enum ? */
        return bounds;

    case ZSTD_c_forceAttachDict:
        ZSTD_STATIC_ASSERT(ZSTD_dictDefaultAttach < ZSTD_dictForceLoad);
        bounds.lowerBound = ZSTD_dictDefaultAttach;
        bounds.upperBound = ZSTD_dictForceLoad;       /* note : how to ensure at compile time that this is the highest value enum ? */
        return bounds;

    case ZSTD_c_literalCompressionMode:
        ZSTD_STATIC_ASSERT(ZSTD_ps_auto < ZSTD_ps_enable && ZSTD_ps_enable < ZSTD_ps_disable);
        bounds.lowerBound = (int)ZSTD_ps_auto;
        bounds.upperBound = (int)ZSTD_ps_disable;
        return bounds;

    case ZSTD_c_targetCBlockSize:
        bounds.lowerBound = ZSTD_TARGETCBLOCKSIZE_MIN;
        bounds.upperBound = ZSTD_TARGETCBLOCKSIZE_MAX;
        return bounds;

    case ZSTD_c_srcSizeHint:
        bounds.lowerBound = ZSTD_SRCSIZEHINT_MIN;
        bounds.upperBound = ZSTD_SRCSIZEHINT_MAX;
        return bounds;

    case ZSTD_c_stableInBuffer:
    case ZSTD_c_stableOutBuffer:
        bounds.lowerBound = (int)ZSTD_bm_buffered;
        bounds.upperBound = (int)ZSTD_bm_stable;
        return bounds;

    case ZSTD_c_blockDelimiters:
        bounds.lowerBound = (int)ZSTD_sf_noBlockDelimiters;
        bounds.upperBound = (int)ZSTD_sf_explicitBlockDelimiters;
        return bounds;

    case ZSTD_c_validateSequences:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_useBlockSplitter:
        bounds.lowerBound = (int)ZSTD_ps_auto;
        bounds.upperBound = (int)ZSTD_ps_disable;
        return bounds;

    case ZSTD_c_useRowMatchFinder:
        bounds.lowerBound = (int)ZSTD_ps_auto;
        bounds.upperBound = (int)ZSTD_ps_disable;
        return bounds;

    case ZSTD_c_deterministicRefPrefix:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_prefetchCDictTables:
        bounds.lowerBound = (int)ZSTD_ps_auto;
        bounds.upperBound = (int)ZSTD_ps_disable;
        return bounds;

    case ZSTD_c_enableSeqProducerFallback:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_maxBlockSize:
        bounds.lowerBound = ZSTD_BLOCKSIZE_MAX_MIN;
        bounds.upperBound = ZSTD_BLOCKSIZE_MAX;
        return bounds;

    case ZSTD_c_searchForExternalRepcodes:
        bounds.lowerBound = (int)ZSTD_ps_auto;
        bounds.upperBound = (int)ZSTD_ps_disable;
        return bounds;

    default:
        bounds.error = ERROR(parameter_unsupported);
        return bounds;
    }
}